

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

size_t __thiscall
level_mesh::assign_contact_groups
          (level_mesh *this,b_submesh_vec *submeshes,b_collision_vec *contacts,
          b_submesh_vec *orphans)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  iterator __first;
  reference ppbVar4;
  pointer ppVar5;
  reference ppbVar6;
  vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
  local_d8;
  b_submesh *local_c0;
  b_submesh *sm1;
  pair<b_submesh_*,_b_submesh_*> *local_b0;
  __normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
  local_a8;
  b_collision_vec_it it1;
  b_collision_vec_it end1;
  undefined1 local_90 [8];
  b_collision contact;
  size_t num_faces;
  b_submesh *sm;
  b_submesh_vec_it end;
  b_submesh_vec_it it;
  uint32_t group;
  undefined1 local_50 [8];
  b_submesh_vec adjacents;
  b_submesh_vec *orphans_local;
  b_collision_vec *contacts_local;
  b_submesh_vec *submeshes_local;
  level_mesh *this_local;
  
  __first = std::
            vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
            ::begin(contacts);
  adjacents.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
                ::end(contacts);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>>
            ((__normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
              )adjacents.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50);
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::reserve
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50,0x80);
  it._M_current._0_4_ = 0;
  end._M_current =
       (b_submesh **)std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::begin(submeshes);
  sm = (b_submesh *)std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::end(submeshes);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
                             *)&sm);
    if (!bVar2) {
      memset(&local_d8,0,0x18);
      std::
      vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      ::vector(&local_d8);
      std::
      vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      ::swap(&local_d8,contacts);
      std::
      vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
      ::~vector(&local_d8);
      std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::~vector
                ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50);
      return (ulong)(uint)it._M_current;
    }
    ppbVar4 = __gnu_cxx::
              __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
              ::operator*(&end);
    num_faces = (size_t)*ppbVar4;
    if ((b_submesh *)num_faces == (b_submesh *)0x0) break;
    if (((b_submesh *)num_faces)->group == 0xffffffff) {
      ((b_submesh *)num_faces)->group = (uint)it._M_current;
      contact.second = (b_submesh *)(((b_submesh *)num_faces)->super_b_model_instance).num_faces;
      while( true ) {
        end1._M_current = (pair<b_submesh_*,_b_submesh_*> *)0x0;
        std::pair<b_submesh_*,_b_submesh_*>::pair<b_submesh_*&,_true>
                  ((pair<b_submesh_*,_b_submesh_*> *)local_90,(b_submesh **)&num_faces,
                   (b_submesh **)&end1);
        it1._M_current =
             (pair<b_submesh_*,_b_submesh_*> *)
             std::
             vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
             ::end(contacts);
        local_b0 = (pair<b_submesh_*,_b_submesh_*> *)
                   std::
                   vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
                   ::begin(contacts);
        sm1 = (b_submesh *)it1._M_current;
        local_a8 = std::
                   lower_bound<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>,std::pair<b_submesh*,b_submesh*>>
                             ((__normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
                               )local_b0,it1._M_current,(pair<b_submesh_*,_b_submesh_*> *)local_90);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=(&local_a8,&it1);
          sVar1 = num_faces;
          bVar2 = false;
          if (bVar3) {
            ppVar5 = __gnu_cxx::
                     __normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
                     ::operator->(&local_a8);
            bVar2 = (b_submesh *)sVar1 == ppVar5->first;
          }
          if (!bVar2) break;
          ppVar5 = __gnu_cxx::
                   __normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
                   ::operator->(&local_a8);
          local_c0 = ppVar5->second;
          if (local_c0->group == 0xffffffff) {
            local_c0->group = (uint)it._M_current;
            std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::push_back
                      ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50,&local_c0);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
          ::operator++(&local_a8);
        }
        bVar2 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::empty
                          ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50);
        if (bVar2) break;
        ppbVar6 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::back
                            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50);
        num_faces = (size_t)*ppbVar6;
        std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::pop_back
                  ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_50);
        contact.second =
             (b_submesh *)
             ((long)&((contact.second)->super_b_model_instance).tag + *(long *)(num_faces + 8));
      }
      if (contact.second < (b_submesh *)0x2) {
        ppbVar4 = __gnu_cxx::
                  __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>
                  ::operator*(&end);
        *ppbVar4 = (b_submesh *)0x0;
        std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::push_back
                  (orphans,(value_type *)&num_faces);
      }
      else {
        it._M_current._0_4_ = (uint)it._M_current + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<b_submesh_**,_std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>_>::
    operator++(&end);
  }
  __assert_fail("sm",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                ,0x1c6,
                "size_t level_mesh::assign_contact_groups(b_submesh_vec &, b_collision_vec &, b_submesh_vec &)"
               );
}

Assistant:

size_t level_mesh::assign_contact_groups(b_submesh_vec& submeshes, b_collision_vec& contacts,
		b_submesh_vec& orphans)
{
	std::sort(contacts.begin(), contacts.end());
	b_submesh_vec adjacents;
	adjacents.reserve(128);
	uint32_t group = 0;
	for (b_submesh_vec_it it = submeshes.begin(), end = submeshes.end(); it != end; ++it) {
		b_submesh* sm = *it;
		xr_assert(sm);
		if (sm->group != BAD_IDX)
			continue;
		sm->group = group;
		size_t num_faces = sm->num_faces;
		for (;;) {
#if defined(_MSC_VER) && _MSC_VER >= 1600
			b_collision contact(sm, nullptr);
#else
			b_collision contact(sm, 0);
#endif
			for (b_collision_vec_it end1 = contacts.end(),
					it1 = std::lower_bound(contacts.begin(), end1, contact);
					it1 != end1 && sm == it1->first; ++it1) {
				b_submesh* sm1 = it1->second;
				if (sm1->group == BAD_IDX) {
					sm1->group = group;
					adjacents.push_back(sm1);
				}
			}
			if (adjacents.empty())
				break;
			sm = adjacents.back();
			adjacents.pop_back();
			num_faces += sm->num_faces;
		}
		if (num_faces > 1) {
			++group;
		} else {
			*it = 0;
			orphans.push_back(sm);
		}
	}
	b_collision_vec().swap(contacts);
	return size_t(group);
}